

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O0

QByteArray * __thiscall ProString::toLatin1(ProString *this)

{
  QString *in_RSI;
  QStringView *in_RDI;
  long in_FS_OFFSET;
  QStringView *this_00;
  QStringView *pos;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pos = in_RDI;
  QStringView::QStringView<QString,_true>(&local_18,in_RSI);
  QStringView::mid(this_00,(qsizetype)pos,(qsizetype)in_RSI);
  QStringView::toLatin1(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QByteArray *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray toLatin1() const { return toQStringView().toLatin1(); }